

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::utp_stream::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (utp_stream *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  io_context *this_00;
  basic_errors local_4c;
  type local_48;
  _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *local_20;
  _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *handler_local;
  endpoint_type *endpoint_local;
  utp_stream *this_local;
  
  local_20 = handler;
  handler_local =
       (_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
        *)endpoint;
  endpoint_local = (endpoint_type *)this;
  if (this->m_impl == (utp_socket_impl *)0x0) {
    this_00 = this->m_io_service;
    local_4c = not_connected;
    std::
    bind<void,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>const&,boost::asio::error::basic_errors>
              (&local_48,handler,&local_4c);
    boost::asio::io_context::
    post<std::_Bind_result<void,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>(boost::asio::error::basic_errors)>>
              (this_00,&local_48);
    std::
    _Bind_result<void,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_(boost::asio::error::basic_errors)>
    ::~_Bind_result(&local_48);
  }
  else {
    std::function<void(boost::system::error_code_const&)>::operator=
              ((function<void(boost::system::error_code_const&)> *)this,handler);
    do_connect(this,(endpoint *)handler_local);
  }
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler, boost::asio::error::not_connected));
			return;
		}

		m_connect_handler = handler;
		do_connect(endpoint);
	}